

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O1

void __thiscall bro::args_t::args_t(args_t *this,int argc,char **argv)

{
  bro bVar1;
  bro *this_00;
  bro *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char **ppcVar7;
  long lVar8;
  bro bVar9;
  int iVar10;
  bool bVar11;
  
  this->force = false;
  this->verbose = false;
  this->decompress = false;
  this->no_copy_stat = false;
  this->input_file = (char *)0x0;
  this->output_file = (char *)0x0;
  *(undefined8 *)((long)&this->output_file + 4) = 0;
  *(undefined8 *)((long)&this->custom_dictionary + 4) = 0;
  this->repeat = 1;
  this->window = 0x16;
  this->fail = true;
  bVar11 = argc == 1;
  if (!bVar11) {
    iVar5 = 1;
    do {
      this_00 = (bro *)argv[iVar5];
      if (*this_00 == (bro)0x2d) {
        bVar9 = (bro)0x0;
        lVar8 = 0;
        do {
          pbVar2 = *(bro **)((long)args_t::switches + lVar8);
          bVar1 = pbVar2[1];
          if (bVar1 == (bro)0x0) {
            bVar9 = *pbVar2;
          }
          iVar10 = 0;
          bVar3 = true;
          if ((*pbVar2 != this_00[1]) ||
             (iVar4 = strcmp((char *)(pbVar2 + 1),(char *)(this_00 + 2)), iVar4 != 0))
          goto LAB_0010392e;
          switch(bVar9) {
          case (bro)0x64:
          case (bro)0x75:
            this->decompress = true;
            break;
          case (bro)0x65:
          case (bro)0x67:
          case (bro)0x68:
          case (bro)0x6a:
          case (bro)0x6b:
          case (bro)0x6c:
          case (bro)0x6d:
          case (bro)0x6e:
          case (bro)0x70:
          case (bro)0x73:
          case (bro)0x74:
switchD_00103801_caseD_65:
            bro::args_t(this_00);
            goto LAB_00103958;
          case (bro)0x66:
            this->force = true;
            break;
          case (bro)0x69:
          case (bro)0x6f:
            if (iVar5 + 1 == argc) {
              bro::args_t(this_00);
            }
            else {
              if (bVar1 != (bro)0x0 || bVar9 != (bro)0x44) {
                ppcVar7 = &this->output_file;
                if (bVar9 == (bro)0x69) {
                  ppcVar7 = &this->input_file;
                }
                *ppcVar7 = argv[iVar5 + 1];
                iVar10 = 5;
                goto LAB_00103929;
              }
              bro::args_t(this_00);
            }
            goto LAB_00103958;
          case (bro)0x71:
          case (bro)0x72:
          case (bro)0x77:
            if (iVar5 + 1 != argc) {
              piVar6 = &this->window;
              if (bVar9 == (bro)0x72) {
                piVar6 = &this->repeat;
              }
              if (bVar9 == (bro)0x71) {
                piVar6 = &this->quality;
              }
              *piVar6 = 0;
              pbVar2 = (bro *)argv[iVar5 + 1];
              iVar10 = 5;
              bVar1 = *pbVar2;
              while (bVar1 != (bro)0x0) {
                if ((byte)((char)bVar1 - 0x3aU) < 0xf6) {
                  bro::args_t(pbVar2);
                  iVar10 = 1;
                  break;
                }
                *piVar6 = (uint)(byte)bVar1 + *piVar6 * 10 + -0x30;
                bVar1 = *pbVar2;
              }
LAB_00103929:
              iVar5 = iVar5 + 1;
              bVar3 = false;
              goto LAB_0010392e;
            }
            bro::args_t(this_00);
LAB_00103958:
            iVar10 = 1;
            goto LAB_001038f5;
          case (bro)0x76:
            this->verbose = true;
            break;
          default:
            if (bVar9 != (bro)0x4e) goto switchD_00103801_caseD_65;
            if (bVar1 == (bro)0x0) {
              bro::args_t(this_00);
              goto LAB_00103958;
            }
            this->no_copy_stat = true;
          }
          iVar10 = 5;
LAB_001038f5:
          bVar3 = false;
LAB_0010392e:
          if (!bVar3) goto LAB_00103966;
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0xb0);
        iVar10 = 5;
LAB_00103966:
        bVar3 = iVar10 == 0 || iVar10 == 5;
      }
      else {
        bro::args_t(this_00);
        bVar3 = false;
      }
      if (!bVar3) {
        if (!bVar11) {
          return;
        }
        break;
      }
      iVar5 = iVar5 + 1;
      bVar11 = iVar5 == argc;
    } while (!bVar11);
  }
  if (this->quality < 100) {
    if (this->window - 0x19U < 0xfffffff1) {
      bro::args_t();
    }
    else {
      this->fail = false;
    }
  }
  else {
    bro::args_t();
  }
  return;
}

Assistant:

args_t(int argc, const char **argv) {
      static const char *switches[] = {
        "f", "-force",
        "d", "-decompress", "-uncompress",
        "v", "-verbose",
        "N", "-no-copy-stat",
        "i", "-in", "-input",
        "o", "-out", "-output"
        "D", "-custom-dictionary",
        "q", "-quality",
        "r", "-repeat",
        "w", "-window",
      };

      for (int i = 1; i != argc; ++i) {
        const char *arg = argv[i];
        if (arg[0] == '-') {
          char short_code = '\0';
          for (auto sw : switches) {
            if (!sw[1]) short_code = sw[0];
            if (sw[0] == arg[1] && !strcmp(sw+1, arg+2)) {
              switch(short_code) {
                case 'f': {
                  force = true;
                } break;
                case 'd': case 'u': {
                  decompress = true;
                } break;
                case 'v': {
                  verbose = true;
                } break;
                case 'N': {
                  if (!sw[1]) { error(arg, "unknown argument", switches); return; }
                  no_copy_stat = true;
                } break;
                case 'i': case 'o': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  if (short_code == 'D' && !sw[1]) { error(arg, "unknown argument", switches); return; }
                  const char * &rhs = short_code == 'i' ? input_file : 'o' ? output_file : custom_dictionary;
                  rhs = argv[++i];
                } break;
                case 'q': case 'r': case 'w': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  int &rhs = short_code == 'q' ? quality : short_code == 'r' ? repeat : window;
                  rhs = 0;
                  const char *p = argv[++i];
                  while (*p) {
                    if (*p < '0' || *p > '9') { error(p, "expected number", switches); return; }
                    rhs = rhs * 10 + *p - '0';
                  }
                } break;
                default: {
                  error(arg, "unknown argument", switches); return;
                } break;
              }
              break;
            }
          }
        } else {
          error(arg, "unexpected argument", switches);
          return;
        }
      }

      if (quality > 99) {
        error("", "quality out of range", switches);
      } else if (window < 10 || window >= 25) {
        error("", "window out of range", switches);
      } else {
        fail = false;
      }
    }